

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot_stmt.cpp
# Opt level: O3

unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> __thiscall
duckdb::Transformer::GenerateCreateEnumStmt
          (Transformer *this,
          unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
          *entry)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var3;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Head_base<0UL,_duckdb::CreateTypeInfo_*,_false> _Var7;
  _Head_base<0UL,_duckdb::CreateStatement_*,_false> _Var8;
  undefined8 uVar9;
  Transformer *this_00;
  CreateTypeInfo *this_01;
  pointer pCVar10;
  pointer pCVar11;
  pointer pPVar12;
  tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> this_02;
  pointer pSVar13;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this_03;
  pointer pOVar14;
  ConstantExpression *this_04;
  pointer pSVar15;
  pointer pCVar16;
  unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
  *in_RDX;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var17;
  OrderByNullType local_da;
  OrderType local_d9;
  _Head_base<0UL,_duckdb::CreateTypeInfo_*,_false> local_d8;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_d0;
  _Head_base<0UL,_duckdb::CreateStatement_*,_false> local_c8;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_c0;
  _Head_base<0UL,_duckdb::ConstantExpression_*,_false> local_b8;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_b0
  ;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_a8;
  undefined1 local_a0 [128];
  
  this_00 = (Transformer *)operator_new(0x80);
  CreateStatement::CreateStatement((CreateStatement *)this_00);
  local_c8._M_head_impl = (CreateStatement *)this_00;
  this_01 = (CreateTypeInfo *)operator_new(0x170);
  CreateTypeInfo::CreateTypeInfo(this_01);
  local_d8._M_head_impl = this_01;
  pCVar10 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&local_d8);
  (pCVar10->super_CreateInfo).temporary = true;
  pCVar10 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&local_d8);
  (pCVar10->super_CreateInfo).internal = false;
  pCVar10 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&local_d8);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(pCVar10->super_CreateInfo).catalog,0,
             (char *)(pCVar10->super_CreateInfo).catalog._M_string_length,0x147c343);
  pCVar10 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&local_d8);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(pCVar10->super_CreateInfo).schema,0,
             (char *)(pCVar10->super_CreateInfo).schema._M_string_length,0x147c343);
  pCVar11 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
            ::operator->(in_RDX);
  pCVar10 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&local_d8);
  ::std::__cxx11::string::operator=((string *)&pCVar10->name,(string *)pCVar11);
  pCVar10 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&local_d8);
  (pCVar10->super_CreateInfo).on_conflict = REPLACE_ON_CONFLICT;
  pCVar11 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
            ::operator->(in_RDX);
  if ((pCVar11->subquery).
      super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl == (QueryNode *)0x0) {
    pCVar11 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
              ::operator->(in_RDX);
    local_d0._M_head_impl =
         (pCVar11->base).
         super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
         super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl;
    (pCVar11->base).super_unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::SelectNode_*,_std::default_delete<duckdb::SelectNode>_>.
    super__Head_base<0UL,_duckdb::SelectNode_*,_false>._M_head_impl = (SelectNode *)0x0;
    pCVar11 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
              ::operator->(in_RDX);
    pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(&pCVar11->column);
    (*(pPVar12->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_a8,pPVar12);
    this_02.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )operator_new(0x60);
    LogicalType::LogicalType((LogicalType *)local_a0,VARCHAR);
    local_a0._64_8_ = local_a8._M_head_impl;
    local_a8._M_head_impl = (ParsedExpression *)0x0;
    CastExpression::CastExpression
              ((CastExpression *)
               this_02.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
               (LogicalType *)local_a0,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_a0 + 0x40),false);
    if ((ParsedExpression *)local_a0._64_8_ != (ParsedExpression *)0x0) {
      (*((BaseExpression *)local_a0._64_8_)->_vptr_BaseExpression[1])();
    }
    local_a0._64_8_ = 0;
    LogicalType::~LogicalType((LogicalType *)local_a0);
    pSVar13 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_d0);
    local_a0._0_8_ =
         this_02.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar13->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_a0);
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )local_a0._0_8_ != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
    pCVar11 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
              ::operator->(in_RDX);
    this_03._M_head_impl = (ParsedExpression *)operator_new(0x50);
    local_a0._0_8_ =
         (pCVar11->column).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pCVar11->column).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    local_a0._64_8_ = (long *)0x0;
    OperatorExpression::OperatorExpression
              ((OperatorExpression *)this_03._M_head_impl,OPERATOR_IS_NOT_NULL,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_a0,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_a0 + 0x40));
    if ((long *)local_a0._64_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_a0._64_8_ + 8))();
    }
    local_a0._64_8_ = 0;
    if ((ParsedExpression *)local_a0._0_8_ != (ParsedExpression *)0x0) {
      (*((BaseExpression *)local_a0._0_8_)->_vptr_BaseExpression[1])();
    }
    pSVar13 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_d0);
    _Var1._M_head_impl =
         (pSVar13->where_clause).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar13->where_clause).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = this_03._M_head_impl;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    pSVar13 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_d0);
    local_a0._0_8_ = operator_new(0x28);
    *(undefined1 *)(local_a0._0_8_ + 8) = 3;
    *(undefined ***)local_a0._0_8_ = &PTR__DistinctModifier_01963978;
    *(long *)(local_a0._0_8_ + 0x10) = 0;
    *(long *)(local_a0._0_8_ + 0x18) = 0;
    *(long *)(local_a0._0_8_ + 0x20) = 0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&(pSVar13->super_QueryNode).modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)local_a0);
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )local_a0._0_8_ != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
    local_b0._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
         operator_new(0x28);
    *(QueryNodeType *)
     ((long)local_b0._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 8) =
         SET_OPERATION_NODE;
    *(undefined ***)
     local_b0._M_t.
     super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
     .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         &PTR__OrderModifier_01963928;
    (((vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_true>
       *)((long)local_b0._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x10))->
    super_vector<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    ).
    super__Vector_base<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)local_b0._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x18) =
         (pointer)0x0;
    *(pointer *)
     ((long)local_b0._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl + 0x20) =
         (pointer)0x0;
    pOVar14 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
              operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                          *)&local_b0);
    local_d9 = ASCENDING;
    local_da = ORDER_DEFAULT;
    Value::INTEGER((Value *)(local_a0 + 0x40),1);
    this_04 = (ConstantExpression *)operator_new(0x78);
    Value::Value((Value *)local_a0,(Value *)(local_a0 + 0x40));
    ConstantExpression::ConstantExpression(this_04,(Value *)local_a0);
    local_b8._M_head_impl = this_04;
    Value::~Value((Value *)local_a0);
    ::std::vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>>::
    emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::ConstantExpression,std::default_delete<duckdb::ConstantExpression>,true>>
              ((vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>> *)&pOVar14->orders,
               &local_d9,&local_da,
               (unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                *)&local_b8);
    if (local_b8._M_head_impl != (ConstantExpression *)0x0) {
      (*((local_b8._M_head_impl)->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression
        [1])();
    }
    local_b8._M_head_impl = (ConstantExpression *)0x0;
    Value::~Value((Value *)(local_a0 + 0x40));
    pSVar13 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_d0);
    local_a0._0_8_ =
         local_b0._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    local_b0._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
         (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          )0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
                *)&(pSVar13->super_QueryNode).modifiers,
               (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
                *)local_a0);
    if ((QueryNode *)local_a0._0_8_ != (QueryNode *)0x0) {
      (*((BaseExpression *)local_a0._0_8_)->_vptr_BaseExpression[1])();
    }
    _Var17._M_head_impl = local_d0._M_head_impl;
    local_d0._M_head_impl = (SelectNode *)0x0;
    if (local_b0._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )0x0) {
      (**(code **)(*(long *)local_b0._M_t.
                            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl +
                  8))();
    }
    if (local_a8._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    if (local_d0._M_head_impl != (SelectNode *)0x0) {
      (*((local_d0._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
    }
  }
  else {
    pCVar11 = unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>
              ::operator->(in_RDX);
    _Var17._M_head_impl =
         (SelectNode *)
         (pCVar11->subquery).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pCVar11->subquery).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
    ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  }
  local_a0._64_8_ = operator_new(0x80);
  ((SQLStatement *)local_a0._64_8_)->type = SELECT_STATEMENT;
  ((SQLStatement *)local_a0._64_8_)->stmt_location = 0;
  ((SQLStatement *)local_a0._64_8_)->stmt_length = 0;
  (((SQLStatement *)local_a0._64_8_)->named_param_map)._M_h._M_buckets =
       &(((SQLStatement *)local_a0._64_8_)->named_param_map)._M_h._M_single_bucket;
  (((SQLStatement *)local_a0._64_8_)->named_param_map)._M_h._M_bucket_count = 1;
  (((SQLStatement *)local_a0._64_8_)->named_param_map)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (((SQLStatement *)local_a0._64_8_)->named_param_map)._M_h._M_element_count = 0;
  (((SQLStatement *)local_a0._64_8_)->named_param_map)._M_h._M_rehash_policy._M_max_load_factor =
       1.0;
  (((SQLStatement *)local_a0._64_8_)->named_param_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (((SQLStatement *)local_a0._64_8_)->named_param_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (((SQLStatement *)local_a0._64_8_)->query)._M_dataplus._M_p =
       (pointer)&(((SQLStatement *)local_a0._64_8_)->query).field_2;
  (((SQLStatement *)local_a0._64_8_)->query)._M_string_length = 0;
  (((SQLStatement *)local_a0._64_8_)->query).field_2._M_local_buf[0] = '\0';
  ((SQLStatement *)local_a0._64_8_)->_vptr_SQLStatement =
       (_func_int **)&PTR__SelectStatement_01981db8;
  ((SQLStatement *)(local_a0._64_8_ + 0x78))->_vptr_SQLStatement = (_func_int **)0x0;
  local_c0._M_head_impl = &(_Var17._M_head_impl)->super_QueryNode;
  TransformMaterializedCTE
            ((Transformer *)local_a0,
             (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             &local_c0);
  pSVar15 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
            ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                          *)(local_a0 + 0x40));
  uVar9 = local_a0._0_8_;
  local_a0._0_8_ = (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
  _Var2._M_head_impl =
       (pSVar15->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar15->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)uVar9;
  if (_Var2._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )local_a0._0_8_ != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_a0._0_8_ + 8))();
    }
  }
  local_a0._0_8_ =
       (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
  if ((SelectNode *)local_c0._M_head_impl != (SelectNode *)0x0) {
    (*((QueryNode *)&(local_c0._M_head_impl)->_vptr_QueryNode)->_vptr_QueryNode[1])();
  }
  uVar9 = local_a0._64_8_;
  local_c0._M_head_impl = (QueryNode *)0x0;
  local_a0._64_8_ = (long *)0x0;
  pCVar10 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&local_d8);
  _Var3._M_head_impl =
       (pCVar10->query).
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (pCVar10->query).
  super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)uVar9;
  if (_Var3._M_head_impl != (SQLStatement *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_SQLStatement + 8))();
  }
  LogicalType::LogicalType((LogicalType *)local_a0,INVALID);
  pCVar10 = unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&local_d8);
  (pCVar10->type).id_ = local_a0[0];
  (pCVar10->type).physical_type_ = local_a0[1];
  peVar5 = (pCVar10->type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (pCVar10->type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pCVar10->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a0._8_8_;
  (pCVar10->type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._16_8_;
  local_a0._8_8_ = peVar5;
  local_a0._16_8_ = p_Var6;
  LogicalType::~LogicalType((LogicalType *)local_a0);
  _Var7._M_head_impl = local_d8._M_head_impl;
  local_d8._M_head_impl = (CreateTypeInfo *)0x0;
  pCVar16 = unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
            ::operator->((unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                          *)&local_c8);
  _Var4._M_head_impl =
       (pCVar16->info).
       super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
       super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
       super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
  (pCVar16->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
  _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       &(_Var7._M_head_impl)->super_CreateInfo;
  if (_Var4._M_head_impl != (CreateInfo *)0x0) {
    (**(code **)(*(long *)&(_Var4._M_head_impl)->super_ParseInfo + 8))();
  }
  _Var8._M_head_impl = local_c8._M_head_impl;
  local_c8._M_head_impl = (CreateStatement *)0x0;
  (this->parent).ptr = (Transformer *)_Var8._M_head_impl;
  if ((long *)local_a0._64_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a0._64_8_ + 8))();
  }
  if (local_d8._M_head_impl != (CreateTypeInfo *)0x0) {
    (*((local_d8._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  if (local_c8._M_head_impl != (CreateStatement *)0x0) {
    (*((local_c8._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
  }
  return (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)
         (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)this;
}

Assistant:

unique_ptr<SQLStatement> Transformer::GenerateCreateEnumStmt(unique_ptr<CreatePivotEntry> entry) {
	auto result = make_uniq<CreateStatement>();
	auto info = make_uniq<CreateTypeInfo>();

	info->temporary = true;
	info->internal = false;
	info->catalog = INVALID_CATALOG;
	info->schema = INVALID_SCHEMA;
	info->name = std::move(entry->enum_name);
	info->on_conflict = OnCreateConflict::REPLACE_ON_CONFLICT;

	// generate the query that will result in the enum creation
	unique_ptr<QueryNode> subselect;
	if (!entry->subquery) {
		auto select_node = std::move(entry->base);
		auto columnref = entry->column->Copy();
		auto cast = make_uniq<CastExpression>(LogicalType::VARCHAR, std::move(columnref));
		select_node->select_list.push_back(std::move(cast));

		auto is_not_null =
		    make_uniq<OperatorExpression>(ExpressionType::OPERATOR_IS_NOT_NULL, std::move(entry->column));
		select_node->where_clause = std::move(is_not_null);

		// order by the column
		select_node->modifiers.push_back(make_uniq<DistinctModifier>());
		auto modifier = make_uniq<OrderModifier>();
		modifier->orders.emplace_back(OrderType::ASCENDING, OrderByNullType::ORDER_DEFAULT,
		                              make_uniq<ConstantExpression>(Value::INTEGER(1)));
		select_node->modifiers.push_back(std::move(modifier));
		subselect = std::move(select_node);
	} else {
		subselect = std::move(entry->subquery);
	}

	auto select = make_uniq<SelectStatement>();
	select->node = TransformMaterializedCTE(std::move(subselect));
	info->query = std::move(select);
	info->type = LogicalType::INVALID;

	result->info = std::move(info);
	return std::move(result);
}